

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O1

char * Curl_mime_contenttype(char *filename)

{
  char *__s;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  char **ppcVar6;
  bool bVar7;
  char *local_40;
  
  if (filename != (char *)0x0) {
    sVar3 = strlen(filename);
    ppcVar6 = &Curl_mime_contenttype::ctts[0].type;
    uVar5 = 0;
    bVar7 = false;
    do {
      __s = ((ContentType *)(ppcVar6 + -1))->extension;
      sVar4 = strlen(__s);
      bVar1 = true;
      if ((sVar4 <= sVar3) && (iVar2 = curl_strequal(filename + (sVar3 - sVar4),__s), iVar2 != 0)) {
        local_40 = *ppcVar6;
        bVar1 = false;
      }
      if (!bVar1) break;
      bVar7 = 8 < uVar5;
      uVar5 = uVar5 + 1;
      ppcVar6 = ppcVar6 + 2;
    } while (uVar5 != 10);
    if (!bVar7) {
      return local_40;
    }
  }
  return (char *)0x0;
}

Assistant:

const char *Curl_mime_contenttype(const char *filename)
{
  /*
   * If no content type was specified, we scan through a few well-known
   * extensions and pick the first we match!
   */
  struct ContentType {
    const char *extension;
    const char *type;
  };
  static const struct ContentType ctts[] = {
    {".gif",  "image/gif"},
    {".jpg",  "image/jpeg"},
    {".jpeg", "image/jpeg"},
    {".png",  "image/png"},
    {".svg",  "image/svg+xml"},
    {".txt",  "text/plain"},
    {".htm",  "text/html"},
    {".html", "text/html"},
    {".pdf",  "application/pdf"},
    {".xml",  "application/xml"}
  };

  if(filename) {
    size_t len1 = strlen(filename);
    const char *nameend = filename + len1;
    unsigned int i;

    for(i = 0; i < sizeof(ctts) / sizeof(ctts[0]); i++) {
      size_t len2 = strlen(ctts[i].extension);

      if(len1 >= len2 && strcasecompare(nameend - len2, ctts[i].extension))
        return ctts[i].type;
    }
  }
  return NULL;
}